

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

int __thiscall
CConsole::ParseCommandArgs
          (CConsole *this,char *pArgs,char *pFormat,FCommandCallback pfnCallback,void *pContext)

{
  char *dst;
  long lVar1;
  int iVar2;
  CConsole *this_00;
  long in_FS_OFFSET;
  CResult Result;
  
  Result.m_apArgs[1] = (char *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CResult::CResult(&Result);
  dst = Result.m_aStringStorage;
  this_00 = (CConsole *)dst;
  str_copy(dst,pArgs,0x401);
  Result.m_pArgsStart = dst;
  iVar2 = ParseArgs(this_00,&Result,pFormat);
  if (pfnCallback != (FCommandCallback)0x0 && iVar2 == 0) {
    (*pfnCallback)(&Result.super_IResult,pContext);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CConsole::ParseCommandArgs(const char *pArgs, const char *pFormat, FCommandCallback pfnCallback, void *pContext)
{
	CResult Result;
	str_copy(Result.m_aStringStorage, pArgs, sizeof(Result.m_aStringStorage));
	Result.m_pArgsStart = Result.m_aStringStorage;

	int Error = ParseArgs(&Result, pFormat);
	if(Error)
		return Error;

	if(pfnCallback)
		pfnCallback(&Result, pContext);

	return 0;
}